

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::SetPendingTTDToTarget
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *dsl)

{
  TTDebuggerSourceLocation *dsl_local;
  ExecutionInfoManager *this_local;
  
  TTDebuggerSourceLocation::SetLocationCopy(&this->m_pendingTTDBP,dsl);
  this->m_pendingTTDMoveMode = 0;
  return;
}

Assistant:

void ExecutionInfoManager::SetPendingTTDToTarget(const TTDebuggerSourceLocation& dsl)
    {
        this->m_pendingTTDBP.SetLocationCopy(dsl);

        this->m_pendingTTDMoveMode = 0;
    }